

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O3

FM_OPL * OPLCreate(UINT32 clock,UINT32 rate,int type)

{
  bool bVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  FM_OPL *OPL;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  size_t __size;
  long lVar9;
  int *piVar10;
  long lVar11;
  FM_OPL *opl;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  
  iVar5 = num_lock + 1;
  bVar1 = num_lock < 1;
  num_lock = iVar5;
  if ((bVar1) && (tablesInit == '\0')) {
    tablesInit = '\x01';
    piVar10 = tl_tab;
    lVar11 = 0;
    do {
      lVar9 = lVar11 + 1;
      dVar12 = exp2((double)(int)lVar9 * 0.03125 * 0.125);
      dVar12 = floor(65536.0 / dVar12);
      iVar5 = ((int)dVar12 >> 5) + (uint)(((uint)(int)dVar12 >> 4 & 1) != 0);
      tl_tab[lVar11 * 2] = iVar5 * 2;
      tl_tab[lVar11 * 2 + 1] = iVar5 * -2;
      lVar8 = 0x804;
      bVar4 = 1;
      do {
        iVar5 = tl_tab[lVar11 * 2] >> (bVar4 & 0x1f);
        *(int *)((long)piVar10 + lVar8 + -4) = iVar5;
        *(int *)((long)piVar10 + lVar8) = -iVar5;
        lVar8 = lVar8 + 0x800;
        bVar4 = bVar4 + 1;
      } while (lVar8 != 0x6004);
      piVar10 = piVar10 + 2;
      lVar11 = lVar9;
    } while (lVar9 != 0x100);
    iVar5 = 1;
    lVar11 = 0;
    do {
      dVar12 = sin((double)iVar5 * 3.141592653589793 * 0.0009765625);
      dVar13 = log(*(double *)(&DAT_0017b800 + (ulong)(dVar12 >= 0.0 && dVar12 != 0.0) * 8) / dVar12
                  );
      dVar13 = ((dVar13 * 8.0) / 0.6931471805599453) * 32.0;
      *(uint *)((long)sin_tab + lVar11) =
           (uint)(dVar12 < 0.0) | (int)(dVar13 + dVar13) + 1U & 0xfffffffe;
      lVar11 = lVar11 + 4;
      iVar5 = iVar5 + 2;
    } while (lVar11 != 0x1000);
    uVar3 = 0;
    do {
      uVar6 = 0x1800;
      uVar7 = 0x1800;
      if (uVar3 < 0x200) {
        uVar7 = sin_tab[uVar3];
      }
      sin_tab[uVar3 + 0x400] = uVar7;
      sin_tab[uVar3 + 0x800] = sin_tab[(uint)uVar3 & 0x1ff];
      if (((uint)uVar3 >> 8 & 1) == 0) {
        uVar6 = sin_tab[uVar3 & 0xff];
      }
      sin_tab[uVar3 + 0xc00] = uVar6;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x400);
  }
  __size = 0x1878;
  if ((type & 2U) == 0) {
    __size = 0x17d8;
  }
  OPL = (FM_OPL *)calloc(1,__size);
  if (OPL != (FM_OPL *)0x0) {
    if ((type & 2U) != 0) {
      OPL->deltat = (YM_DELTAT *)(OPL + 1);
    }
    OPL->type = (UINT8)type;
    OPL_clock_changed(OPL,clock,rate);
    auVar2 = _DAT_001769f0;
    lVar11 = 0;
    auVar14 = _DAT_001769e0;
    do {
      if (SUB164(auVar14 ^ auVar2,4) == -0x80000000 && SUB164(auVar14 ^ auVar2,0) < -0x7ffffff7) {
        (&OPL->P_CH[0].Muted)[lVar11] = '\0';
        (&OPL->P_CH[1].Muted)[lVar11] = '\0';
      }
      lVar8 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar8 + 2;
      lVar11 = lVar11 + 0x180;
    } while (lVar11 != 0x780);
    OPL->MuteSpc[4] = '\0';
    OPL->MuteSpc[5] = '\0';
    OPL->MuteSpc[0] = '\0';
    OPL->MuteSpc[1] = '\0';
    OPL->MuteSpc[2] = '\0';
    OPL->MuteSpc[3] = '\0';
  }
  return OPL;
}

Assistant:

static FM_OPL *OPLCreate(UINT32 clock, UINT32 rate, int type)
{
	char *ptr;
	FM_OPL *OPL;
	int state_size;

	if (OPL_LockTable() == -1) return NULL;

	/* calculate OPL state size */
	state_size  = sizeof(FM_OPL);

#if BUILD_Y8950
	if (type&OPL_TYPE_ADPCM) state_size+= sizeof(YM_DELTAT);
#endif

	/* allocate memory block */
	ptr = (char *)calloc(1, state_size);
	if (ptr==NULL)
		return NULL;

	OPL  = (FM_OPL *)ptr;

	ptr += sizeof(FM_OPL);

#if BUILD_Y8950
	if (type&OPL_TYPE_ADPCM)
	{
		OPL->deltat = (YM_DELTAT *)ptr;
		ptr += sizeof(YM_DELTAT);
	}
#endif

	OPL->type  = type;
	OPL_clock_changed(OPL, clock, rate);

	opl_set_mute_mask(OPL, 0x0000);

	return OPL;
}